

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess_p.h
# Opt level: O3

QString * __thiscall QProcEnvValue::string(QString *__return_storage_ptr__,QProcEnvValue *this)

{
  QString *this_00;
  QArrayData *data;
  char16_t *pcVar1;
  qsizetype qVar2;
  Data *pDVar3;
  long lVar4;
  storage_type *in_RCX;
  long in_FS_OFFSET;
  QByteArrayView ba;
  QString local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  lVar4 = (this->stringValue).d.size;
  if (lVar4 == 0) {
    this_00 = (QString *)(this->byteValue).d.size;
    if (this_00 == (QString *)0x0) {
      lVar4 = 0;
    }
    else {
      ba.m_data = in_RCX;
      ba.m_size = (qsizetype)(this->byteValue).d.ptr;
      QString::fromLocal8Bit(&local_38,this_00,ba);
      data = &((this->stringValue).d.d)->super_QArrayData;
      pcVar1 = (this->stringValue).d.ptr;
      (this->stringValue).d.d = local_38.d.d;
      (this->stringValue).d.ptr = local_38.d.ptr;
      qVar2 = (this->stringValue).d.size;
      (this->stringValue).d.size = local_38.d.size;
      local_38.d.d = (Data *)data;
      local_38.d.ptr = pcVar1;
      local_38.d.size = qVar2;
      if (data != (QArrayData *)0x0) {
        LOCK();
        (data->ref_)._q_value.super___atomic_base<int>._M_i =
             (data->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((data->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(data,2,0x10);
        }
      }
      lVar4 = (this->stringValue).d.size;
    }
  }
  pDVar3 = (this->stringValue).d.d;
  (__return_storage_ptr__->d).d = pDVar3;
  (__return_storage_ptr__->d).ptr = (this->stringValue).d.ptr;
  (__return_storage_ptr__->d).size = lVar4;
  if (pDVar3 != (Data *)0x0) {
    LOCK();
    (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString string() const
    {
        if (stringValue.isEmpty() && !byteValue.isEmpty())
            stringValue = QString::fromLocal8Bit(byteValue);
        return stringValue;
    }